

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O0

void __thiscall EventLoop::~EventLoop(EventLoop *this)

{
  long in_FS_OFFSET;
  EventLoop *this_local;
  
  if (((this->looping_ ^ 0xffU) & 1) == 0) {
    __assert_fail("!looping_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/net/EventLoop.cpp"
                  ,0x27,"EventLoop::~EventLoop()");
  }
  *(undefined8 *)(in_FS_OFFSET + -0x40) = 0;
  close(this->wakeupFd_);
  std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~vector
            (&this->pendingFuntors_);
  MutexLock::~MutexLock(&this->mutex_);
  std::shared_ptr<Channel>::~shared_ptr(&this->wakeupChannel_);
  std::vector<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_>::~vector
            (&this->activeChannels_);
  std::shared_ptr<TimerHeap>::~shared_ptr(&this->timer_);
  std::shared_ptr<EPoller>::~shared_ptr(&this->poller_);
  noncopyable::~noncopyable((noncopyable *)this);
  return;
}

Assistant:

EventLoop::~EventLoop() {
    assert(!looping_);
    t_loopInThisThread = NULL;
    close(wakeupFd_);
}